

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O1

void __thiscall draco::PointCloud::DeleteAttribute(PointCloud *this,int att_id)

{
  int *__src;
  pointer *ppiVar1;
  iterator __position;
  Type TVar2;
  uint32_t att_unique_id;
  pointer puVar3;
  PointAttribute *pPVar4;
  GeometryMetadata *this_00;
  int *piVar5;
  pointer piVar6;
  int i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __dest;
  long lVar7;
  long lVar8;
  long lVar9;
  int local_1c;
  
  if (-1 < att_id) {
    puVar3 = (this->attributes_).
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(uint)att_id <
        (ulong)((long)(this->attributes_).
                      super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)) {
      __position._M_current = puVar3 + (uint)att_id;
      pPVar4 = ((__position._M_current)->_M_t).
               super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
               .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
      TVar2 = (pPVar4->super_GeometryAttribute).attribute_type_;
      att_unique_id = (pPVar4->super_GeometryAttribute).unique_id_;
      local_1c = att_id;
      std::
      vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
      ::_M_erase(&this->attributes_,__position);
      this_00 = (this->metadata_)._M_t.
                super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                ._M_t.
                super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
                .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl;
      if (this_00 != (GeometryMetadata *)0x0) {
        GeometryMetadata::DeleteAttributeMetadataByUniqueId(this_00,att_unique_id);
      }
      if (TVar2 < NAMED_ATTRIBUTES_COUNT) {
        __dest = std::
                 __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (this->named_attribute_index_[TVar2].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            this->named_attribute_index_[TVar2].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish,&local_1c);
        piVar5 = this->named_attribute_index_[TVar2].super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (__dest._M_current != piVar5) {
          __src = __dest._M_current + 1;
          if (__src != piVar5) {
            memmove(__dest._M_current,__src,(long)piVar5 - (long)__src);
          }
          ppiVar1 = &this->named_attribute_index_[TVar2].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish;
          *ppiVar1 = *ppiVar1 + -1;
        }
      }
      lVar7 = 0;
      do {
        piVar6 = this->named_attribute_index_[lVar7].super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar8 = (long)this->named_attribute_index_[lVar7].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish - (long)piVar6;
        if (lVar8 != 0) {
          lVar8 = lVar8 >> 2;
          lVar9 = 0;
          do {
            if (local_1c < piVar6[lVar9]) {
              piVar6[lVar9] = piVar6[lVar9] + -1;
            }
            lVar9 = lVar9 + 1;
          } while (lVar8 + (ulong)(lVar8 == 0) != lVar9);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
    }
  }
  return;
}

Assistant:

void PointCloud::DeleteAttribute(int att_id) {
  if (att_id < 0 || att_id >= attributes_.size()) {
    return;  // Attribute does not exist.
  }
  const GeometryAttribute::Type att_type =
      attributes_[att_id]->attribute_type();
  const uint32_t unique_id = attribute(att_id)->unique_id();
  attributes_.erase(attributes_.begin() + att_id);
  // Remove metadata if applicable.
  if (metadata_) {
    metadata_->DeleteAttributeMetadataByUniqueId(unique_id);
  }

  // Remove the attribute from the named attribute list if applicable.
  if (att_type < GeometryAttribute::NAMED_ATTRIBUTES_COUNT) {
    const auto it = std::find(named_attribute_index_[att_type].begin(),
                              named_attribute_index_[att_type].end(), att_id);
    if (it != named_attribute_index_[att_type].end()) {
      named_attribute_index_[att_type].erase(it);
    }
  }

  // Update ids of all subsequent named attributes (decrease them by one).
  for (int i = 0; i < GeometryAttribute::NAMED_ATTRIBUTES_COUNT; ++i) {
    for (int j = 0; j < named_attribute_index_[i].size(); ++j) {
      if (named_attribute_index_[i][j] > att_id) {
        named_attribute_index_[i][j]--;
      }
    }
  }
}